

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall
duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::resize
          (SparseArray<duckdb_re2::NFA::Thread_*> *this,int new_max_size)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  IndexValue *__result;
  IndexValue *pIVar4;
  IndexValue *this_00;
  int in_ESI;
  SparseArray<duckdb_re2::NFA::Thread_*> *in_RDI;
  PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue> b;
  PODArray<int> a;
  int old_max_size;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  int iVar5;
  PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>
  *in_stack_ffffffffffffffb0;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  DebugCheckInvariants(in_RDI);
  iVar1 = max_size((SparseArray<duckdb_re2::NFA::Thread_*> *)
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar1 < in_ESI) {
    iVar2 = max_size((SparseArray<duckdb_re2::NFA::Thread_*> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    PODArray<int>::PODArray((PODArray<int> *)in_stack_ffffffffffffffb0,iVar5);
    PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::PODArray
              (in_stack_ffffffffffffffb0,iVar5);
    piVar3 = PODArray<int>::data((PODArray<int> *)0x8335b6);
    iVar5 = (int)((ulong)piVar3 >> 0x20);
    iVar1 = iVar2;
    __result = (IndexValue *)PODArray<int>::data((PODArray<int> *)0x8335cf);
    std::copy_n<int*,int,int*>(&in_RDI->size_,iVar5,(int *)__result);
    pIVar4 = PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::data
                       ((PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue> *)
                        0x8335f9);
    this_00 = PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::data
                        ((PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue> *
                         )0x833612);
    std::
    copy_n<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread*>::IndexValue*,int,duckdb_re2::SparseArray<duckdb_re2::NFA::Thread*>::IndexValue*>
              ((IndexValue *)in_RDI,iVar5,__result);
    PODArray<int>::operator=
              ((PODArray<int> *)this_00,(PODArray<int> *)CONCAT44(iVar2,in_stack_ffffffffffffff88));
    PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::operator=
              ((PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue> *)this_00,
               (PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff88));
    MaybeInitializeMemory
              ((SparseArray<duckdb_re2::NFA::Thread_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
               (int)((ulong)pIVar4 >> 0x20),(int)pIVar4);
    PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::~PODArray
              ((PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue> *)0x833672)
    ;
    PODArray<int>::~PODArray((PODArray<int> *)0x83367c);
  }
  if (in_ESI < in_RDI->size_) {
    in_RDI->size_ = in_ESI;
  }
  DebugCheckInvariants(in_RDI);
  return;
}

Assistant:

void SparseArray<Value>::resize(int new_max_size) {
  DebugCheckInvariants();
  if (new_max_size > max_size()) {
    const int old_max_size = max_size();

    // Construct these first for exception safety.
    PODArray<int> a(new_max_size);
    PODArray<IndexValue> b(new_max_size);

    std::copy_n(sparse_.data(), old_max_size, a.data());
    std::copy_n(dense_.data(), old_max_size, b.data());

    sparse_ = std::move(a);
    dense_ = std::move(b);

    MaybeInitializeMemory(old_max_size, new_max_size);
  }
  if (size_ > new_max_size)
    size_ = new_max_size;
  DebugCheckInvariants();
}